

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQuery
          (ClientContext *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,bool allow_stream_result)

{
  undefined7 in_register_00000011;
  pointer *__ptr;
  case_insensitive_map_t<BoundParameterData> empty_param_list;
  undefined1 local_48 [16];
  __node_base local_38;
  size_type local_30;
  _Prime_rehash_policy _Stack_28;
  __node_base_ptr local_18;
  __node_base_ptr p_Stack_10;
  
  local_48._8_8_ = &p_Stack_10;
  local_38._M_nxt = (_Hash_node_base *)0x1;
  local_30 = 0;
  _Stack_28._M_max_load_factor = 0.0;
  _Stack_28._4_4_ = 0;
  _Stack_28._M_next_resize._0_4_ = 0x3f800000;
  local_18 = (__node_base_ptr)0x0;
  p_Stack_10 = (__node_base_ptr)0x0;
  local_48._0_8_ = *(undefined8 *)CONCAT71(in_register_00000011,allow_stream_result);
  *(undefined8 *)CONCAT71(in_register_00000011,allow_stream_result) = 0;
  PendingQuery(this,statement,(case_insensitive_map_t<BoundParameterData> *)local_48,
               (bool)((char)local_48 + '\b'));
  if ((__buckets_ptr)local_48._0_8_ != (__buckets_ptr)0x0) {
    (*(code *)(*(__node_base_ptr *)local_48._0_8_)[1]._M_nxt)();
  }
  local_48._0_8_ = (__buckets_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_48 + 8));
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQuery(unique_ptr<SQLStatement> statement,
                                                           bool allow_stream_result) {
	case_insensitive_map_t<BoundParameterData> empty_param_list;
	return PendingQuery(std::move(statement), empty_param_list, allow_stream_result);
}